

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

Var Js::TypedArrayBase::EntryFrom(RecyclableObject *function,CallInfo callInfo,...)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  JavascriptLibrary *pJVar3;
  ThreadContext *pTVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  BOOL BVar8;
  uint uVar9;
  uint32 uVar10;
  Attributes AVar11;
  int iVar12;
  undefined4 *puVar13;
  Var pvVar14;
  RecyclableObject *pRVar15;
  TempGuestArenaAllocatorObject *tempGuestAllocator;
  RecyclableObject *pRVar16;
  TypedArrayBase *pTVar17;
  Type *ppvVar18;
  uint64 uVar19;
  uint64 uVar20;
  JavascriptMethod p_Var21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar22;
  double dVar23;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar24;
  ulong uVar25;
  ulong uVar26;
  int in_stack_00000010;
  undefined1 local_128 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  TypedArrayBase *local_f0;
  JavascriptArray *local_e8;
  anon_class_24_3_1d317480_for_newObjectCreationFunction local_e0;
  undefined1 local_c8 [8];
  ArgumentReader args;
  Var nextValue;
  TypedArrayBase *local_98;
  JavascriptArray *local_90;
  RecyclableObject *local_88;
  RecyclableObject *items;
  double local_78;
  RecyclableObject *local_70;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *local_68;
  double local_60;
  undefined4 *local_58;
  RecyclableObject *local_50;
  RecyclableObject *local_48;
  ImplicitCallFlags local_39;
  ScriptContext *local_38;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x55a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar6) goto LAB_00d5a274;
    *puVar13 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_c8 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_c8,(CallInfo *)&__tag.entry.next);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  pJVar3 = (pSVar2->super_ScriptContextBase).javascriptLibrary;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_128,function,(CallInfo)__tag.entry.next,
             L"[TypedArray].from",&stack0x00000000);
  if (((ulong)__tag.entry.next & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x560,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar6) goto LAB_00d5a274;
    *puVar13 = 0;
  }
  if (((ulong)local_c8 & 0xffffff) == 0) {
LAB_00d5a27b:
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec40,L"[TypedArray].from");
  }
  pvVar14 = Arguments::operator[]((Arguments *)local_c8,0);
  bVar6 = JavascriptOperators::IsConstructor(pvVar14);
  if (!bVar6) goto LAB_00d5a27b;
  pvVar14 = Arguments::operator[]((Arguments *)local_c8,0);
  pRVar15 = VarTo<Js::RecyclableObject>(pvVar14);
  bVar6 = JavascriptLibrary::IsTypedArrayConstructor(pRVar15,pSVar2);
  local_88 = (RecyclableObject *)0x0;
  if (((ulong)local_c8 & 0xfffffe) == 0) {
LAB_00d5a28f:
    JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec36,L"[TypedArray].from");
  }
  pvVar14 = Arguments::operator[]((Arguments *)local_c8,1);
  BVar8 = JavascriptConversion::ToObject(pvVar14,pSVar2,&local_88);
  if (BVar8 == 0) goto LAB_00d5a28f;
  uVar9 = local_c8._0_4_ & 0xffffff;
  items = pRVar15;
  if (uVar9 < 3) {
    local_70 = (RecyclableObject *)0x0;
    local_48 = (RecyclableObject *)0x0;
  }
  else {
    pvVar14 = Arguments::operator[]((Arguments *)local_c8,2);
    bVar7 = JavascriptConversion::IsCallable(pvVar14);
    if (!bVar7) {
      JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec34,L"[TypedArray].from");
    }
    pvVar14 = Arguments::operator[]((Arguments *)local_c8,2);
    local_48 = VarTo<Js::RecyclableObject>(pvVar14);
    if (((ulong)local_c8 & 0xfffffc) == 0) {
      local_70 = (pJVar3->super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    else {
      local_70 = (RecyclableObject *)Arguments::operator[]((Arguments *)local_c8,3);
    }
  }
  pRVar15 = JavascriptOperators::GetIterator(local_88,pSVar2,true);
  if (pRVar15 != (RecyclableObject *)0x0) {
    tempGuestAllocator = ScriptContext::GetTemporaryGuestAllocator(pSVar2,L"Runtime");
    local_68 = (List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
               )new<Memory::ArenaAllocator>(0x30,&tempGuestAllocator->allocator,0x364470);
    (local_68->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).alloc =
         &tempGuestAllocator->allocator;
    (local_68->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014dbfd8;
    (local_68->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer =
         (Type)0x0;
    (local_68->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count = 0;
    local_68->length = 0;
    local_68->increment = 4;
    pRVar16 = JavascriptOperators::CacheIteratorNext(pRVar15,pSVar2);
    bVar7 = JavascriptOperators::IteratorStepAndValue
                      (pRVar15,pSVar2,pRVar16,&args.super_Arguments.Values);
    pLVar24 = local_68;
    local_38 = (ScriptContext *)CONCAT71(local_38._1_7_,bVar6);
    if (bVar7) {
      do {
        JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
        EnsureArray(pLVar24,0);
        iVar12 = (pLVar24->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).
                 count;
        (pLVar24->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).buffer
        [iVar12] = args.super_Arguments.Values;
        (pLVar24->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).count =
             iVar12 + 1;
        bVar6 = JavascriptOperators::IteratorStepAndValue
                          (pRVar15,pSVar2,pRVar16,&args.super_Arguments.Values);
      } while (bVar6);
    }
    pLVar24 = local_68;
    pRVar15 = items;
    local_e0.len = (local_68->super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>).
                   count;
    uVar25 = (ulong)local_e0.len;
    pTVar4 = pSVar2->threadContext;
    local_e0.constructor = items;
    if ((char)local_38 == '\0') {
      args.super_Arguments.Values = (Type)items;
      bVar6 = pTVar4->reentrancySafeOrHandled;
      pTVar4->reentrancySafeOrHandled = true;
      local_e0.scriptContext = pSVar2;
      AVar11 = FunctionInfo::GetAttributes(items);
      bVar7 = ThreadContext::HasNoSideEffect(pTVar4,pRVar15,AVar11);
      if (bVar7) {
        pRVar15 = (RecyclableObject *)
                  anon_func::anon_class_24_1_2f014396::
                  anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                            ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)
                             &args.super_Arguments.Values);
        bVar7 = ThreadContext::IsOnStack(pRVar15);
LAB_00d5958f:
        local_50 = pRVar15;
        if (bVar7 != false) {
          pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
        }
      }
      else if ((pTVar4->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
        if ((AVar11 & HasNoSideEffect) != None) {
          pRVar15 = (RecyclableObject *)
                    anon_func::anon_class_24_1_2f014396::
                    anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                              ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)
                               &args.super_Arguments.Values);
          bVar7 = ThreadContext::IsOnStack(pRVar15);
          goto LAB_00d5958f;
        }
        IVar1 = pTVar4->implicitCallFlags;
        local_50 = (RecyclableObject *)
                   anon_func::anon_class_24_1_2f014396::
                   anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                             ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)
                              &args.super_Arguments.Values);
        pTVar4->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      }
      else {
        pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
        local_50 = (((((((((pRVar15->type).ptr)->javascriptLibrary).ptr)->
                       super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                    javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      pTVar4->reentrancySafeOrHandled = bVar6;
      pLVar24 = local_68;
    }
    else {
      bVar6 = pTVar4->reentrancySafeOrHandled;
      pTVar4->reentrancySafeOrHandled = true;
      local_e0.scriptContext = pSVar2;
      local_50 = (RecyclableObject *)
                 anon_func::anon_class_24_1_2f014396::
                 anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()(&local_e0);
      pTVar4->reentrancySafeOrHandled = bVar6;
    }
    pRVar16 = local_50;
    bVar6 = VarIs<Js::TypedArrayBase>(local_50);
    if ((bVar6) &&
       (local_f0 = UnsafeVarTo<Js::TypedArrayBase>(pRVar16), local_f0 != (TypedArrayBase *)0x0)) {
      items = (RecyclableObject *)0x0;
      local_90 = (JavascriptArray *)0x0;
    }
    else {
      local_90 = JavascriptArray::TryVarToNonES5Array(pRVar16);
      items = (RecyclableObject *)CONCAT71((int7)((ulong)local_90 >> 8),1);
      local_f0 = (TypedArrayBase *)0x0;
    }
    if (uVar25 != 0) {
      local_58 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      uVar26 = 0;
      do {
        uVar10 = (uint32)uVar26;
        ppvVar18 = JsUtil::
                   List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                   ::Item(pLVar24,uVar10);
        local_38 = (ScriptContext *)*ppvVar18;
        if (2 < uVar9) {
          if (local_48 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *local_58 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                        ,0x5b4,"(mapFn != nullptr)","mapFn != nullptr");
            if (!bVar6) goto LAB_00d5a274;
            *local_58 = 0;
          }
          if (local_70 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *local_58 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                        ,0x5b5,"(mapFnThisArg != nullptr)","mapFnThisArg != nullptr"
                                       );
            if (!bVar6) goto LAB_00d5a274;
            *local_58 = 0;
          }
          if ((int)uVar10 < 0) {
            local_78 = (double)(uVar26 & 0xffffffff);
            uVar19 = NumberUtilities::ToSpecial(local_78);
            bVar6 = NumberUtilities::IsNan(local_78);
            if (((bVar6) &&
                (uVar20 = NumberUtilities::ToSpecial(local_78), uVar20 != 0xfff8000000000000)) &&
               (uVar20 = NumberUtilities::ToSpecial(local_78), uVar20 != 0x7ff8000000000000)) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_58 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                          ,0xa2,
                                          "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                          ,"We should only produce a NaN with this value");
              if (!bVar6) goto LAB_00d5a274;
              *local_58 = 0;
            }
            local_60 = (double)(uVar19 ^ 0xfffc000000000000);
          }
          else {
            local_60 = (double)(uVar26 + 0x1000000000000);
          }
          pRVar15 = local_48;
          pTVar4 = pSVar2->threadContext;
          local_78 = (double)CONCAT71(local_78._1_7_,pTVar4->reentrancySafeOrHandled);
          pTVar4->reentrancySafeOrHandled = true;
          AVar11 = FunctionInfo::GetAttributes(local_48);
          bVar6 = ThreadContext::HasNoSideEffect(pTVar4,pRVar15,AVar11);
          if (bVar6) {
            ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
            pLVar24 = local_68;
            if (pSVar2->threadContext->noJsReentrancy == true) {
              Throw::FatalJsReentrancyError();
            }
            p_Var21 = RecyclableObject::GetEntryPoint(local_48);
            CheckIsExecutable(local_48,p_Var21);
            p_Var21 = RecyclableObject::GetEntryPoint(local_48);
            local_38 = (ScriptContext *)(*p_Var21)(local_48,(CallInfo)0x2000003,0);
            bVar6 = ThreadContext::IsOnStack(local_38);
LAB_00d59af3:
            if (bVar6 != false) {
              pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
            }
          }
          else if ((pTVar4->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag
                  ) {
            if ((AVar11 & HasNoSideEffect) != None) {
              ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
              pLVar24 = local_68;
              if (pSVar2->threadContext->noJsReentrancy == true) {
                Throw::FatalJsReentrancyError();
              }
              p_Var21 = RecyclableObject::GetEntryPoint(local_48);
              CheckIsExecutable(local_48,p_Var21);
              p_Var21 = RecyclableObject::GetEntryPoint(local_48);
              local_38 = (ScriptContext *)
                         (*p_Var21)(local_48,(CallInfo)local_48,0x2000003,0,0,0,0,0x2000003,local_70
                                    ,local_38,local_60);
              bVar6 = ThreadContext::IsOnStack(local_38);
              goto LAB_00d59af3;
            }
            IVar1 = pTVar4->implicitCallFlags;
            ThreadContext::CheckAndResetReentrancySafeOrHandled(pSVar2->threadContext);
            pRVar15 = local_48;
            if (pSVar2->threadContext->noJsReentrancy == true) {
              Throw::FatalJsReentrancyError();
            }
            p_Var21 = RecyclableObject::GetEntryPoint(local_48);
            CheckIsExecutable(pRVar15,p_Var21);
            p_Var21 = RecyclableObject::GetEntryPoint(pRVar15);
            local_38 = (ScriptContext *)(*p_Var21)(pRVar15,(CallInfo)0x2000003,0);
            pTVar4->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
            pLVar24 = local_68;
          }
          else {
            pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
            local_38 = (ScriptContext *)
                       (((((((((local_48->type).ptr)->javascriptLibrary).ptr)->
                           super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase)
                        .javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
            pLVar24 = local_68;
          }
          pTVar4->reentrancySafeOrHandled = local_78._0_1_;
          pRVar16 = local_50;
        }
        if ((char)items == '\0') {
          (*(local_f0->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x70])(local_f0,uVar26 & 0xffffffff,local_38);
        }
        else if (local_90 == (JavascriptArray *)0x0) {
          JavascriptOperators::OP_SetElementI_UInt32
                    (pRVar16,uVar10,local_38,pSVar2,PropertyOperation_ThrowIfNotExtensible);
        }
        else {
          (*(local_90->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (local_90,uVar26 & 0xffffffff,local_38);
        }
        uVar26 = uVar26 + 1;
      } while (uVar25 != uVar26);
    }
    ScriptContext::ReleaseTemporaryGuestAllocator(pSVar2,tempGuestAllocator);
    goto LAB_00d5a20b;
  }
  pvVar14 = JavascriptOperators::OP_GetLength(local_88,pSVar2);
  if (((ulong)pvVar14 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar14 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar14 & 0xffff000000000000) == 0x1000000000000) goto LAB_00d595b2;
    uVar10 = JavascriptConversion::ToUInt32_Full(pvVar14,pSVar2);
    pvVar14 = (Var)(ulong)uVar10;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar7) goto LAB_00d5a274;
    *puVar13 = 0;
LAB_00d595b2:
    if (((ulong)pvVar14 & 0x1ffff00000000) != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar7) {
LAB_00d5a274:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *puVar13 = 0;
    }
  }
  pRVar15 = local_88;
  bVar7 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(local_88);
  pRVar16 = items;
  if ((bVar7) &&
     (pTVar17 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(pRVar15),
     pTVar17 != (TypedArrayBase *)0x0)) {
    local_68 = (List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
               )0x0;
    local_90 = (JavascriptArray *)0x0;
  }
  else {
    local_90 = JavascriptArray::TryVarToNonES5Array(local_88);
    local_68 = (List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
               )CONCAT71((int7)((ulong)local_90 >> 8),1);
    pTVar17 = (TypedArrayBase *)0x0;
  }
  pTVar4 = pSVar2->threadContext;
  local_e0.constructor = pRVar16;
  uVar22 = (uint)pvVar14;
  local_e0.len = uVar22;
  local_38 = pSVar2;
  if (bVar6) {
    bVar6 = pTVar4->reentrancySafeOrHandled;
    pTVar4->reentrancySafeOrHandled = true;
    local_e0.scriptContext = pSVar2;
    local_50 = (RecyclableObject *)
               anon_func::anon_class_24_1_2f014396::
               anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()(&local_e0);
    pTVar4->reentrancySafeOrHandled = bVar6;
    pRVar15 = local_48;
  }
  else {
    args.super_Arguments.Values = (Type)pRVar16;
    bVar6 = pTVar4->reentrancySafeOrHandled;
    pTVar4->reentrancySafeOrHandled = true;
    local_e0.scriptContext = pSVar2;
    AVar11 = FunctionInfo::GetAttributes(pRVar16);
    bVar7 = ThreadContext::HasNoSideEffect(pTVar4,pRVar16,AVar11);
    if (bVar7) {
      pRVar16 = (RecyclableObject *)
                anon_func::anon_class_24_1_2f014396::
                anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                          ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)
                           &args.super_Arguments.Values);
      bVar7 = ThreadContext::IsOnStack(pRVar16);
      pRVar15 = local_48;
      local_50 = pRVar16;
      if (bVar7) {
LAB_00d5979d:
        pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
      }
    }
    else if ((pTVar4->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
      if ((AVar11 & HasNoSideEffect) == None) {
        IVar1 = pTVar4->implicitCallFlags;
        local_50 = (RecyclableObject *)
                   anon_func::anon_class_24_1_2f014396::
                   anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                             ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)
                              &args.super_Arguments.Values);
        pTVar4->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
        pRVar15 = local_48;
      }
      else {
        pRVar16 = (RecyclableObject *)
                  anon_func::anon_class_24_1_2f014396::
                  anon_class_24_3_1d317480_for_newObjectCreationFunction::operator()
                            ((anon_class_24_3_1d317480_for_newObjectCreationFunction *)
                             &args.super_Arguments.Values);
        pRVar15 = local_48;
        bVar7 = ThreadContext::IsOnStack(pRVar16);
        local_50 = pRVar16;
        if (bVar7) goto LAB_00d5979d;
      }
    }
    else {
      pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
      pRVar15 = local_48;
      local_50 = (((((((((pRVar16->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase)
                     .scriptContext.ptr)->super_ScriptContextBase).javascriptLibrary)->
                 super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    pTVar4->reentrancySafeOrHandled = bVar6;
  }
  bVar6 = VarIs<Js::TypedArrayBase>(local_50);
  if ((bVar6) &&
     (local_98 = UnsafeVarTo<Js::TypedArrayBase>(local_50), local_98 != (TypedArrayBase *)0x0)) {
    items = (RecyclableObject *)0x0;
    local_e8 = (JavascriptArray *)0x0;
  }
  else {
    local_e8 = JavascriptArray::TryVarToNonES5Array(local_50);
    items = (RecyclableObject *)CONCAT71((int7)((ulong)local_e8 >> 8),1);
    local_98 = (TypedArrayBase *)0x0;
  }
  pRVar16 = local_50;
  if (uVar22 != 0) {
    local_58 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_78 = (double)((ulong)pvVar14 & 0xffffffff);
    dVar23 = 0.0;
    do {
      uVar10 = SUB84(dVar23,0);
      if ((char)local_68 == '\0') {
        iVar12 = (*(pTVar17->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                   super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x72])(pTVar17,(ulong)dVar23 & 0xffffffff);
        pRVar16 = (RecyclableObject *)CONCAT44(extraout_var_00,iVar12);
      }
      else if (local_90 == (JavascriptArray *)0x0) {
        pRVar16 = (RecyclableObject *)
                  JavascriptOperators::OP_GetElementI_UInt32(local_88,uVar10,local_38);
      }
      else {
        iVar12 = (*(local_90->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                   [0x72])(local_90,(ulong)dVar23 & 0xffffffff);
        pRVar16 = (RecyclableObject *)CONCAT44(extraout_var,iVar12);
      }
      if (2 < uVar9) {
        if (pRVar15 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_58 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                      ,0x5ff,"(mapFn != nullptr)","mapFn != nullptr");
          if (!bVar6) goto LAB_00d5a274;
          *local_58 = 0;
        }
        if (local_70 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *local_58 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                      ,0x600,"(mapFnThisArg != nullptr)","mapFnThisArg != nullptr");
          if (!bVar6) goto LAB_00d5a274;
          *local_58 = 0;
        }
        if ((int)uVar10 < 0) {
          local_60 = (double)((ulong)dVar23 & 0xffffffff);
          uVar19 = NumberUtilities::ToSpecial(local_60);
          bVar6 = NumberUtilities::IsNan(local_60);
          if (((bVar6) &&
              (uVar20 = NumberUtilities::ToSpecial(local_60), uVar20 != 0xfff8000000000000)) &&
             (uVar20 = NumberUtilities::ToSpecial(local_60), uVar20 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *local_58 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar6) goto LAB_00d5a274;
            *local_58 = 0;
          }
          uVar25 = uVar19 ^ 0xfffc000000000000;
        }
        else {
          uVar25 = (long)dVar23 + 0x1000000000000;
        }
        pTVar4 = local_38->threadContext;
        local_60 = (double)CONCAT71(local_60._1_7_,pTVar4->reentrancySafeOrHandled);
        pTVar4->reentrancySafeOrHandled = true;
        AVar11 = FunctionInfo::GetAttributes(pRVar15);
        bVar6 = ThreadContext::HasNoSideEffect(pTVar4,pRVar15,AVar11);
        if (bVar6) {
          ThreadContext::CheckAndResetReentrancySafeOrHandled(local_38->threadContext);
          pRVar15 = local_48;
          if (local_38->threadContext->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var21 = RecyclableObject::GetEntryPoint(local_48);
          CheckIsExecutable(pRVar15,p_Var21);
          p_Var21 = RecyclableObject::GetEntryPoint(pRVar15);
          pRVar16 = (RecyclableObject *)(*p_Var21)(pRVar15,(CallInfo)0x2000003,0);
          bVar6 = ThreadContext::IsOnStack(pRVar16);
LAB_00d5a022:
          if (bVar6 != false) {
            pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
          }
        }
        else if ((pTVar4->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag)
        {
          if ((AVar11 & HasNoSideEffect) != None) {
            ThreadContext::CheckAndResetReentrancySafeOrHandled(local_38->threadContext);
            pRVar15 = local_48;
            if (local_38->threadContext->noJsReentrancy == true) {
              Throw::FatalJsReentrancyError();
            }
            p_Var21 = RecyclableObject::GetEntryPoint(local_48);
            CheckIsExecutable(pRVar15,p_Var21);
            p_Var21 = RecyclableObject::GetEntryPoint(pRVar15);
            pRVar16 = (RecyclableObject *)
                      (*p_Var21)(pRVar15,(CallInfo)pRVar15,0x2000003,0,0,0,0,0x2000003,local_70,
                                 pRVar16,uVar25);
            bVar6 = ThreadContext::IsOnStack(pRVar16);
            goto LAB_00d5a022;
          }
          local_39 = pTVar4->implicitCallFlags;
          ThreadContext::CheckAndResetReentrancySafeOrHandled(local_38->threadContext);
          pRVar15 = local_48;
          if (local_38->threadContext->noJsReentrancy == true) {
            Throw::FatalJsReentrancyError();
          }
          p_Var21 = RecyclableObject::GetEntryPoint(local_48);
          CheckIsExecutable(pRVar15,p_Var21);
          p_Var21 = RecyclableObject::GetEntryPoint(pRVar15);
          pRVar16 = (RecyclableObject *)(*p_Var21)(pRVar15,(CallInfo)0x2000003,0);
          pTVar4->implicitCallFlags = local_39 | ImplicitCall_Accessor;
        }
        else {
          pTVar4->implicitCallFlags = pTVar4->implicitCallFlags | ImplicitCall_Accessor;
          pRVar16 = (((((((((local_48->type).ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
                     javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue.ptr;
          pRVar15 = local_48;
        }
        pTVar4->reentrancySafeOrHandled = local_60._0_1_;
      }
      if ((char)items == '\0') {
        (*(local_98->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
          super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x70])(local_98,(ulong)dVar23 & 0xffffffff,pRVar16);
      }
      else if (local_e8 == (JavascriptArray *)0x0) {
        JavascriptOperators::OP_SetElementI_UInt32
                  (local_50,uVar10,pRVar16,local_38,PropertyOperation_ThrowIfNotExtensible);
      }
      else {
        (*(local_e8->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                  (local_e8,(ulong)dVar23 & 0xffffffff,pRVar16);
      }
      dVar23 = (double)((long)dVar23 + 1);
      pRVar16 = local_50;
    } while (local_78 != dVar23);
  }
LAB_00d5a20b:
  AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_128);
  return pRVar16;
}

Assistant:

Var TypedArrayBase::EntryFrom(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JavascriptLibrary* library = scriptContext->GetLibrary();

        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("[TypedArray].from"));

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(TypedArray_Prototype_from);

        if (args.Info.Count < 1 || !JavascriptOperators::IsConstructor(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedFunction, _u("[TypedArray].from"));
        }

        RecyclableObject* constructor = VarTo<RecyclableObject>(args[0]);
        bool isDefaultConstructor = JavascriptLibrary::IsTypedArrayConstructor(constructor, scriptContext);
        RecyclableObject* items = nullptr;

        if (args.Info.Count < 2 || !JavascriptConversion::ToObject(args[1], scriptContext, &items))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedObject, _u("[TypedArray].from"));
        }

        bool mapping = false;
        RecyclableObject* mapFn = nullptr;
        Var mapFnThisArg = nullptr;

        if (args.Info.Count >= 3)
        {
            if (!JavascriptConversion::IsCallable(args[2]))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("[TypedArray].from"));
            }

            mapFn = VarTo<RecyclableObject>(args[2]);

            if (args.Info.Count >= 4)
            {
                mapFnThisArg = args[3];
            }
            else
            {
                mapFnThisArg = library->GetUndefined();
            }

            mapping = true;
        }

        Var newObj;
        RecyclableObject* iterator = JavascriptOperators::GetIterator(items, scriptContext, true /* optional */);

        if (iterator != nullptr)
        {
            DECLARE_TEMP_GUEST_ALLOCATOR(tempAlloc);

            ACQUIRE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext, _u("Runtime"));
            {
                // Create a temporary list to hold the items returned from the iterator.
                // We will then iterate over this list and append those items into the object we will return.
                // We have to collect the items into this temporary list because we need to call the
                // new object constructor with a length of items and we don't know what length will be
                // until we iterate across all the items.
                // Consider: Could be possible to fast-path this in order to avoid creating the temporary list
                //       for types we know such as TypedArray. We know the length of a TypedArray but we still
                //       have to be careful in case there is a proxy which could return anything from [[Get]]
                //       or the built-in @@iterator has been replaced.
                JsUtil::List<Var, ArenaAllocator>* tempList = IteratorToList(iterator, scriptContext, tempAlloc);

                uint32 len = tempList->Count();
                newObj = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
                {
                    Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(len, scriptContext) };
                    Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                    return TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), len, scriptContext);
                });

                TypedArrayBase* newTypedArrayBase = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);
                JavascriptArray* newArr = nullptr;

                if (!newTypedArrayBase)
                {
                    newArr = JavascriptArray::TryVarToNonES5Array(newObj);
                }

                for (uint32 k = 0; k < len; k++)
                {
                    Var kValue = tempList->Item(k);

                    if (mapping)
                    {
                        Assert(mapFn != nullptr);
                        Assert(mapFnThisArg != nullptr);

                        Var kVar = JavascriptNumber::ToVar(k, scriptContext);
                        kValue = scriptContext->GetThreadContext()->ExecuteImplicitCall(mapFn, Js::ImplicitCall_Accessor, [=]()->Js::Var
                        {
                            return CALL_FUNCTION(scriptContext->GetThreadContext(), mapFn, CallInfo(CallFlags_Value, 3), mapFnThisArg, kValue, kVar);
                        });
                    }

                    // We're likely to have constructed a new TypedArray, but the constructor could return any object
                    if (newTypedArrayBase)
                    {
                        newTypedArrayBase->DirectSetItem(k, kValue);
                    }
                    else if (newArr)
                    {
                        newArr->SetItem(k, kValue, Js::PropertyOperation_ThrowIfNotExtensible);
                    }
                    else
                    {
                        JavascriptOperators::OP_SetElementI_UInt32(newObj, k, kValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible);
                    }
                }
            }
            RELEASE_TEMP_GUEST_ALLOCATOR(tempAlloc, scriptContext);
        }
        else
        {
            Var lenValue = JavascriptOperators::OP_GetLength(items, scriptContext);
            uint32 len = JavascriptConversion::ToUInt32(lenValue, scriptContext);

            TypedArrayBase* itemsTypedArrayBase = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(items);
            JavascriptArray* itemsArray = nullptr;

            if (!itemsTypedArrayBase)
            {
                itemsArray = JavascriptArray::TryVarToNonES5Array(items);
            }

            newObj = JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
            {
                Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(len, scriptContext) };
                Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), len, scriptContext);
            });

            TypedArrayBase* newTypedArrayBase = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);
            JavascriptArray* newArr = nullptr;

            if (!newTypedArrayBase)
            {
                newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            }

            for (uint32 k = 0; k < len; k++)
            {
                Var kValue;

                // The items source could be anything, but we already know if it's a TypedArray or Array
                if (itemsTypedArrayBase)
                {
                    kValue = itemsTypedArrayBase->DirectGetItem(k);
                }
                else if (itemsArray)
                {
                    kValue = itemsArray->DirectGetItem(k);
                }
                else
                {
                    kValue = JavascriptOperators::OP_GetElementI_UInt32(items, k, scriptContext);
                }

                if (mapping)
                {
                    Assert(mapFn != nullptr);
                    Assert(mapFnThisArg != nullptr);

                    Var kVar = JavascriptNumber::ToVar(k, scriptContext);
                    kValue = scriptContext->GetThreadContext()->ExecuteImplicitCall(mapFn, Js::ImplicitCall_Accessor, [=]()->Js::Var
                    {
                        return CALL_FUNCTION(scriptContext->GetThreadContext(), mapFn, CallInfo(CallFlags_Value, 3), mapFnThisArg, kValue, kVar);
                    });
                }

                // If constructor built a TypedArray (likely) or Array (maybe likely) we can do a more direct set operation
                if (newTypedArrayBase)
                {
                    newTypedArrayBase->DirectSetItem(k, kValue);
                }
                else if (newArr)
                {
                    newArr->SetItem(k, kValue, Js::PropertyOperation_ThrowIfNotExtensible);
                }
                else
                {
                    JavascriptOperators::OP_SetElementI_UInt32(newObj, k, kValue, scriptContext, Js::PropertyOperation_ThrowIfNotExtensible);
                }
            }
        }

        return newObj;
    }